

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_yang_ctx_free(lysp_yang_ctx *ctx)

{
  if (ctx == (lysp_yang_ctx *)0x0) {
    return;
  }
  if ((lysp_yang_ctx *)ctx->main_ctx == ctx) {
    ly_set_erase(&ctx->tpdfs_nodes,(_func_void_void_ptr *)0x0);
    ly_set_erase(&ctx->grps_nodes,(_func_void_void_ptr *)0x0);
  }
  if (((ctx->tpdfs_nodes).count == 0) && ((ctx->grps_nodes).count == 0)) {
    ly_set_erase(&ctx->ext_inst,(_func_void_void_ptr *)0x0);
    ly_set_rm_index(ctx->parsed_mods,ctx->parsed_mods->count - 1,(_func_void_void_ptr *)0x0);
    if (ctx->parsed_mods->count == 0) {
      ly_set_free(ctx->parsed_mods,(_func_void_void_ptr *)0x0);
    }
    free(ctx);
    return;
  }
  __assert_fail("!ctx->tpdfs_nodes.count && !ctx->grps_nodes.count",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                ,0x6b1,"void lysp_yang_ctx_free(struct lysp_yang_ctx *)");
}

Assistant:

void
lysp_yang_ctx_free(struct lysp_yang_ctx *ctx)
{
    if (ctx) {
        if (ctx->main_ctx == (struct lysp_ctx *)ctx) {
            ly_set_erase(&ctx->tpdfs_nodes, NULL);
            ly_set_erase(&ctx->grps_nodes, NULL);
        }
        assert(!ctx->tpdfs_nodes.count && !ctx->grps_nodes.count);
        ly_set_erase(&ctx->ext_inst, NULL);
        ly_set_rm_index(ctx->parsed_mods, ctx->parsed_mods->count - 1, NULL);
        if (!ctx->parsed_mods->count) {
            ly_set_free(ctx->parsed_mods, NULL);
        }
        free(ctx);
    }
}